

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

ON__UINT32 * __thiscall
ON_DimStyle::Internal_GetOverrideParentBit(ON_DimStyle *this,field field_id,ON__UINT32 *mask)

{
  ON__UINT32 *pOVar1;
  
  if (field_id < Count) {
    if (field_id < ExtensionLineExtension) {
      pOVar1 = (ON__UINT32 *)0x0;
    }
    else {
      *mask = 1 << ((byte)field_id & 0x1f);
      switch(field_id) {
      case ExtensionLineExtension:
      case ExtensionLineOffset:
      case Arrowsize:
      case LeaderArrowsize:
      case Centermark:
      case TextGap:
      case TextHeight:
      case DimTextLocation:
      case MaskFrameType:
      case LengthResolution:
      case AngleFormat:
      case AngleResolution:
      case Font:
      case LengthFactor:
      case Alternate:
      case AlternateLengthFactor:
      case AlternateLengthFactor|Name:
      case AlternateLengthResolution:
      case Prefix:
      case Suffix:
      case AlternatePrefix:
      case AlternateSuffix:
      case DimensionLineExtension:
      case SuppressExtension1:
      case SuppressExtension2:
      case ExtLineColorSource:
      case DimLineColorSource:
      case ArrowColorSource:
      case TextColorSource:
        pOVar1 = &this->m_field_override_parent_bits0;
        break;
      default:
        pOVar1 = &this->m_field_override_parent_bits1;
        break;
      case SuppressArrow1:
      case SuppressArrow2:
      case TextmoveLeader:
      case ArclengthSymbol:
      case StackTextheightScale:
      case StackFormat:
      case AltRound:
      case Round:
      case AngularRound:
      case AltZeroSuppress:
      case AngularRound|Index:
      case AngleZeroSuppress:
      case ZeroSuppress:
      case AltBelow:
      case ArrowType1:
      case ArrowType2:
      case LeaderArrowType:
      case ArrowBlockId1:
      case ArrowBlockId2:
      case LeaderArrowBlock:
      case DimRadialTextLocation:
      case TextVerticalAlignment:
      case LeaderTextVerticalAlignment:
      case LeaderContentAngleStyle:
      case LeaderCurveType:
      case LeaderContentAngle:
      case LeaderHasLanding:
      case LeaderLandingLength:
      case MaskFlags:
      case CentermarkStyle:
      case TextHorizontalAlignment:
      case LeaderTextHorizontalAlignment:
        pOVar1 = &this->m_field_override_parent_bits2;
        break;
      case DrawForward:
      case SignedOrdinate:
      case UnitSystem:
      case TextMask:
      case TextOrientation:
      case LeaderTextOrientation:
      case DimTextOrientation:
      case DimRadialTextOrientation:
      case DimTextAngleStyle:
      case DimRadialTextAngleStyle:
      case TextUnderlined:
      case TextUnderlined|Name:
      case DimTextAngleStyle|ExtensionLineOffset:
      case DimensionLengthDisplay:
      case AlternateDimensionLengthDisplay:
      case ForceDimLine:
      case ArrowFit:
      case TextFit:
      case DecimalSeparator:
        pOVar1 = &this->m_field_override_parent_bits3;
      }
    }
  }
  else {
    pOVar1 = (ON__UINT32 *)0x0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0x144d,"","Invalid field_id value.");
  }
  return pOVar1;
}

Assistant:

ON__UINT32* ON_DimStyle::Internal_GetOverrideParentBit(ON_DimStyle::field field_id, ON__UINT32* mask) const
{
  unsigned int bitdex = 0;
  unsigned int i = static_cast<unsigned int>(field_id);
  if (i >= static_cast<unsigned int>(ON_DimStyle::field::Count))
  {
    ON_ERROR("Invalid field_id value.");
    return nullptr;
  }

  if (i <= static_cast<unsigned int>(ON_DimStyle::field::Index))
  {
    // query makes no sense for Unset, Name and Index
    // because these cannot be inherited from parent.
    // false is returned instead of the more accurate true
    // because that's the way this code has worked for years
    // and being accurate would cause bugs at this point.
    return nullptr; 
  }

  while (i >= 32 && bitdex < 4)
  {
    bitdex++;
    i -= 32;
  }
  *mask = (1 << i);

  const ON__UINT32* bits;
  if (0 == bitdex)
    bits = &m_field_override_parent_bits0;
  else if (1 == bitdex)
    bits = &m_field_override_parent_bits1;
  else if (2 == bitdex)
    bits = &m_field_override_parent_bits2;
  else if (3 == bitdex)
    bits = &m_field_override_parent_bits3;
  else
  {
    ON_ERROR("field_id too big - add another m_independent_of_parent_bitsN = 0 member.");
    bits = nullptr;
    *mask = 0;
  }

  return const_cast<ON__UINT32*>(bits);
}